

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_35(QPDF *pdf,char *arg2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  char cVar4;
  int iVar5;
  mapped_type *pmVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  ostream *poVar11;
  _Base_ptr p_Var12;
  undefined8 uVar13;
  ulong uVar14;
  long *plVar15;
  int iVar16;
  string filename;
  string t;
  QPDFObjectHandle stream;
  QPDFObjectHandle embeddedFiles;
  QPDFObjectHandle root;
  QPDFObjectHandle item;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  attachments;
  key_type local_1b8;
  element_type *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  element_type local_188;
  undefined7 uStack_187;
  long *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  long local_148;
  long lStack_140;
  long *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long local_128 [2];
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  long *local_100 [2];
  long local_f0 [2];
  string local_e0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  string local_d0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string local_a0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  string local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDF::getRoot();
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/Names","");
  QPDFObjectHandle::getKey((string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/EmbeddedFiles","");
  QPDFObjectHandle::getKey(local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/Names","");
  QPDFObjectHandle::getKey((string *)&local_198);
  p_Var1 = p_Stack_110;
  p_Stack_110 = p_Stack_190;
  local_118 = local_198;
  local_198 = (element_type *)0x0;
  p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  for (iVar16 = 0; iVar5 = QPDFObjectHandle::getArrayNItems(), iVar16 < iVar5; iVar16 = iVar16 + 1)
  {
    QPDFObjectHandle::getArrayItem((int)local_70);
    cVar4 = QPDFObjectHandle::isDictionary();
    if (cVar4 != '\0') {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"/Type","");
      QPDFObjectHandle::getKey(local_80);
      cVar4 = QPDFObjectHandle::isName();
      if (cVar4 == '\0') {
        cVar4 = '\0';
      }
      else {
        local_178 = &local_168;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"/Type","");
        QPDFObjectHandle::getKey(local_90);
        QPDFObjectHandle::getName_abi_cxx11_();
        iVar5 = std::__cxx11::string::compare((char *)&local_198);
        if (iVar5 == 0) {
          local_158 = &local_148;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/EF","");
          QPDFObjectHandle::getKey(local_a0);
          cVar4 = QPDFObjectHandle::isDictionary();
          if (cVar4 == '\0') {
            cVar4 = '\0';
          }
          else {
            local_138 = local_128;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"/EF","");
            QPDFObjectHandle::getKey(local_e0);
            local_100[0] = local_f0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"/F","");
            QPDFObjectHandle::getKey(local_b0);
            cVar4 = QPDFObjectHandle::isStream();
            if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
            }
            if (local_100[0] != local_f0) {
              operator_delete(local_100[0],local_f0[0] + 1);
            }
            if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
            }
            if (local_138 != local_128) {
              operator_delete(local_138,local_128[0] + 1);
            }
          }
          if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148 + 1);
          }
        }
        else {
          cVar4 = '\0';
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
        }
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
      }
      if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      if (cVar4 != '\0') {
        local_198 = &local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/F","");
        QPDFObjectHandle::getKey((string *)&local_178);
        QPDFObjectHandle::getStringValue_abi_cxx11_();
        if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
        }
        local_198 = &local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/EF","");
        QPDFObjectHandle::getKey((string *)&local_138);
        local_178 = &local_168;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"/F","");
        QPDFObjectHandle::getKey((string *)&local_158);
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
        }
        QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)(string *)&local_198);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
                               *)&local_60,&local_1b8);
        p_Var3 = p_Stack_190;
        peVar2 = local_198;
        local_198 = (element_type *)0x0;
        p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var1 = (pmVar6->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
        (pmVar6->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
        (pmVar6->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var3;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
        }
        if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
  }
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      lVar7 = Buffer::getBuffer();
      lVar8 = Buffer::getSize();
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,lVar7,lVar8 + lVar7);
      if (local_1b8._M_string_length != 0) {
        uVar14 = 0;
LAB_0011ffcf:
        if ((byte)local_1b8._M_dataplus._M_p[uVar14] < 0x7f) goto code_r0x0011ffd5;
        local_198 = &local_188;
        p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_188 = (element_type)0x0;
        uVar14 = 0;
        do {
          if (local_1b8._M_string_length <= uVar14) {
            uVar13 = std::__throw_out_of_range_fmt
                               ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
            }
            if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
            }
            if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
            ::~_Rb_tree(&local_60);
            _Unwind_Resume(uVar13);
          }
          if ((byte)(local_1b8._M_dataplus._M_p[uVar14] + 0x81U) < 0xa1) {
            std::__cxx11::string::append((char *)&local_198);
          }
          else {
            std::__cxx11::string::push_back((char)&local_198);
          }
          uVar14 = uVar14 + 1;
          uVar9 = 0x14;
          if (local_1b8._M_string_length < 0x14) {
            uVar9 = local_1b8._M_string_length;
          }
        } while (uVar14 < uVar9);
        QUtil::uint_to_string_abi_cxx11_((ulonglong)&local_138,(int)local_1b8._M_string_length);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x147cbf);
        local_158 = &local_148;
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_148 = *plVar15;
          lStack_140 = plVar10[3];
        }
        else {
          local_148 = *plVar15;
          local_158 = (long *)*plVar10;
        }
        local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_158);
        plVar15 = plVar10 + 2;
        if ((long *)*plVar10 == plVar15) {
          local_168 = *plVar15;
          lStack_160 = plVar10[3];
          local_178 = &local_168;
        }
        else {
          local_168 = *plVar15;
          local_178 = (long *)*plVar10;
        }
        local_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar10[1];
        *plVar10 = (long)plVar15;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_178);
        if (local_178 != &local_168) {
          operator_delete(local_178,local_168 + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_138 != local_128) {
          operator_delete(local_138,local_128[0] + 1);
        }
        std::__cxx11::string::_M_assign((string *)&local_1b8);
        if (local_198 != &local_188) {
          operator_delete(local_198,CONCAT71(uStack_187,local_188) + 1);
        }
      }
LAB_001201a6:
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,":\n",2);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"--END--\n",8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != &local_60._M_impl.super__Rb_tree_header);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Buffer>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
code_r0x0011ffd5:
  uVar14 = uVar14 + 1;
  if (local_1b8._M_string_length == uVar14) goto LAB_001201a6;
  goto LAB_0011ffcf;
}

Assistant:

static void
test_35(QPDF& pdf, char const* arg2)
{
    // Extract attachments

    std::map<std::string, std::shared_ptr<Buffer>> attachments;
    QPDFObjectHandle root = pdf.getRoot();
    QPDFObjectHandle names = root.getKey("/Names");
    QPDFObjectHandle embeddedFiles = names.getKey("/EmbeddedFiles");
    names = embeddedFiles.getKey("/Names");
    for (int i = 0; i < names.getArrayNItems(); ++i) {
        QPDFObjectHandle item = names.getArrayItem(i);
        if (item.isDictionary() && item.getKey("/Type").isName() &&
            (item.getKey("/Type").getName() == "/Filespec") && item.getKey("/EF").isDictionary() &&
            item.getKey("/EF").getKey("/F").isStream()) {
            std::string filename = item.getKey("/F").getStringValue();
            QPDFObjectHandle stream = item.getKey("/EF").getKey("/F");
            attachments[filename] = stream.getStreamData();
        }
    }
    for (auto const& iter: attachments) {
        std::string const& filename = iter.first;
        std::string data = std::string(
            reinterpret_cast<char const*>(iter.second->getBuffer()), iter.second->getSize());
        bool is_binary = false;
        for (size_t i = 0; i < data.size(); ++i) {
            if ((data.at(i) < 0) || (data.at(i) > 126)) {
                is_binary = true;
                break;
            }
        }
        if (is_binary) {
            std::string t;
            for (size_t i = 0; i < std::min(data.size(), QIntC::to_size(20)); ++i) {
                if ((data.at(i) >= 32) && (data.at(i) <= 126)) {
                    t += data.at(i);
                } else {
                    t += ".";
                }
            }
            t += " (" + QUtil::uint_to_string(data.size()) + " bytes)";
            data = t;
        }
        std::cout << filename << ":\n" << data << "--END--\n";
    }
}